

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O0

bool __thiscall
SID::set_sampling_parameters
          (SID *this,double clock_freq,sampling_method method,double sample_freq,double pass_freq,
          double filter_scale)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  void *pvVar6;
  uint uVar7;
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar8;
  double dVar9;
  double x;
  double dVar10;
  double dVar11;
  __type _Var12;
  double dVar13;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  int j_1;
  double val;
  double sincwt;
  double Kaiser;
  double temp;
  double wt;
  double jx;
  int j;
  double j_offset;
  int fir_offset;
  int i;
  int n;
  int res;
  double f_cycles_per_sample;
  double f_samples_per_cycle;
  int N;
  double I0beta;
  double beta;
  double wc;
  double dw;
  double A;
  double pi;
  double local_120;
  double local_110;
  int local_d4;
  int local_9c;
  int local_8c;
  double local_30;
  
  local_30 = in_XMM2_Qa;
  if ((in_ESI == 2) || (in_ESI == 3)) {
    if (16384.0 <= (in_XMM0_Qa * 125.0) / in_XMM1_Qa) {
      return false;
    }
    if (0.0 <= in_XMM2_Qa) {
      if ((in_XMM1_Qa * 0.9) / 2.0 < in_XMM2_Qa) {
        return false;
      }
    }
    else {
      local_30 = 20000.0;
      if (0.9 <= 40000.0 / in_XMM1_Qa) {
        local_30 = (in_XMM1_Qa * 0.9) / 2.0;
      }
    }
    if ((in_XMM3_Qa < 0.9) || (1.0 < in_XMM3_Qa)) {
      return false;
    }
  }
  *(double *)(in_RDI + 0x4230) = in_XMM0_Qa;
  *(int *)(in_RDI + 0x423c) = in_ESI;
  *(int *)(in_RDI + 0x4240) = (int)((in_XMM0_Qa / in_XMM1_Qa) * 65536.0 + 0.5);
  *(undefined4 *)(in_RDI + 0x4244) = 0;
  *(undefined2 *)(in_RDI + 0x424c) = 0;
  if ((in_ESI == 2) || (in_ESI == 3)) {
    dVar8 = log10(1.52587890625e-05);
    dVar9 = (((local_30 * 2.0) / in_XMM1_Qa + 1.0) * 3.141592653589793) / 2.0;
    x = (dVar8 * -20.0 - 8.7) * 0.1102;
    dVar10 = I0(x);
    uVar7 = (uint)((dVar8 * -20.0 - 7.95) /
                   ((1.0 - (local_30 * 2.0) / in_XMM1_Qa) * 3.141592653589793 * 2.285) + 0.5);
    dVar8 = in_XMM0_Qa / in_XMM1_Qa;
    *(int *)(in_RDI + 0x4250) = (int)((double)(int)((uVar7 & 1) + uVar7) * dVar8) + 1;
    *(uint *)(in_RDI + 0x4250) = *(uint *)(in_RDI + 0x4250) | 1;
    iVar4 = 0xc911;
    if (in_ESI == 2) {
      iVar4 = 0x11d;
    }
    dVar11 = log((double)iVar4 / dVar8);
    _Var12 = std::log<int>(0);
    dVar11 = ceil(dVar11 / _Var12);
    *(int *)(in_RDI + 0x4254) = 1 << ((byte)(int)dVar11 & 0x1f);
    if (*(void **)(in_RDI + 0x4260) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x4260));
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)(*(int *)(in_RDI + 0x4250) * *(int *)(in_RDI + 0x4254));
    uVar5 = SUB168(auVar3 * ZEXT816(2),0);
    if (SUB168(auVar3 * ZEXT816(2),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pvVar6 = operator_new__(uVar5);
    *(void **)(in_RDI + 0x4260) = pvVar6;
    for (local_8c = 0; local_8c < *(int *)(in_RDI + 0x4254); local_8c = local_8c + 1) {
      iVar4 = *(int *)(in_RDI + 0x4250);
      iVar1 = *(int *)(in_RDI + 0x4250);
      iVar2 = *(int *)(in_RDI + 0x4254);
      for (local_9c = -*(int *)(in_RDI + 0x4250) / 2; local_9c <= *(int *)(in_RDI + 0x4250) / 2;
          local_9c = local_9c + 1) {
        dVar13 = (double)local_9c - (double)local_8c / (double)iVar2;
        dVar11 = (dVar9 * dVar13) / dVar8;
        dVar13 = dVar13 / (double)(*(int *)(in_RDI + 0x4250) / 2);
        if (1.0 < ABS(dVar13)) {
          local_110 = 0.0;
        }
        else {
          dVar13 = sqrt(-dVar13 * dVar13 + 1.0);
          local_110 = I0(x * dVar13);
          local_110 = local_110 / dVar10;
        }
        if (ABS(dVar11) < 1e-06) {
          local_120 = 1.0;
        }
        else {
          local_120 = sin(dVar11);
          local_120 = local_120 / dVar11;
        }
        *(short *)(*(long *)(in_RDI + 0x4260) + (long)(local_8c * iVar4 + iVar1 / 2 + local_9c) * 2)
             = (short)(int)(((in_XMM3_Qa * 32768.0 * (in_XMM1_Qa / in_XMM0_Qa) * dVar9) /
                            3.141592653589793) * local_120 * local_110 + 0.5);
      }
    }
    if (*(long *)(in_RDI + 0x4258) == 0) {
      pvVar6 = operator_new__(0x10000);
      *(void **)(in_RDI + 0x4258) = pvVar6;
    }
    for (local_d4 = 0; local_d4 < 0x8000; local_d4 = local_d4 + 1) {
      *(undefined2 *)(*(long *)(in_RDI + 0x4258) + (long)local_d4 * 2) = 0;
    }
    *(undefined4 *)(in_RDI + 0x4248) = 0;
  }
  else {
    if (*(void **)(in_RDI + 0x4258) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x4258));
    }
    if (*(void **)(in_RDI + 0x4260) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x4260));
    }
    *(undefined8 *)(in_RDI + 0x4258) = 0;
    *(undefined8 *)(in_RDI + 0x4260) = 0;
  }
  return true;
}

Assistant:

bool SID::set_sampling_parameters(double clock_freq, sampling_method method,
				  double sample_freq, double pass_freq,
				  double filter_scale)
{
  // Check resampling constraints.
  if (method == SAMPLE_RESAMPLE_INTERPOLATE || method == SAMPLE_RESAMPLE_FAST)
  {
    // Check whether the sample ring buffer would overfill.
    if (FIR_N*clock_freq/sample_freq >= RINGSIZE) {
      return false;
    }

    // The default passband limit is 0.9*sample_freq/2 for sample
    // frequencies below ~ 44.1kHz, and 20kHz for higher sample frequencies.
    if (pass_freq < 0) {
      pass_freq = 20000;
      if (2*pass_freq/sample_freq >= 0.9) {
	pass_freq = 0.9*sample_freq/2;
      }
    }
    // Check whether the FIR table would overfill.
    else if (pass_freq > 0.9*sample_freq/2) {
      return false;
    }

    // The filter scaling is only included to avoid clipping, so keep
    // it sane.
    if (filter_scale < 0.9 || filter_scale > 1.0) {
      return false;
    }
  }

  clock_frequency = clock_freq;
  sampling = method;

  cycles_per_sample =
    cycle_count(clock_freq/sample_freq*(1 << FIXP_SHIFT) + 0.5);

  sample_offset = 0;
  sample_prev = 0;

  // FIR initialization is only necessary for resampling.
  if (method != SAMPLE_RESAMPLE_INTERPOLATE && method != SAMPLE_RESAMPLE_FAST)
  {
    delete[] sample;
    delete[] fir;
    sample = 0;
    fir = 0;
    return true;
  }

  const double pi = 3.1415926535897932385;

  // 16 bits -> -96dB stopband attenuation.
  const double A = -20*log10(1.0/(1 << 16));
  // A fraction of the bandwidth is allocated to the transition band,
  double dw = (1 - 2*pass_freq/sample_freq)*pi;
  // The cutoff frequency is midway through the transition band.
  double wc = (2*pass_freq/sample_freq + 1)*pi/2;

  // For calculation of beta and N see the reference for the kaiserord
  // function in the MATLAB Signal Processing Toolbox:
  // http://www.mathworks.com/access/helpdesk/help/toolbox/signal/kaiserord.html
  const double beta = 0.1102*(A - 8.7);
  const double I0beta = I0(beta);

  // The filter order will maximally be 124 with the current constraints.
  // N >= (96.33 - 7.95)/(2.285*0.1*pi) -> N >= 123
  // The filter order is equal to the number of zero crossings, i.e.
  // it should be an even number (sinc is symmetric about x = 0).
  int N = int((A - 7.95)/(2.285*dw) + 0.5);
  N += N & 1;

  double f_samples_per_cycle = sample_freq/clock_freq;
  double f_cycles_per_sample = clock_freq/sample_freq;

  // The filter length is equal to the filter order + 1.
  // The filter length must be an odd number (sinc is symmetric about x = 0).
  fir_N = int(N*f_cycles_per_sample) + 1;
  fir_N |= 1;

  // We clamp the filter table resolution to 2^n, making the fixpoint
  // sample_offset a whole multiple of the filter table resolution.
  int res = method == SAMPLE_RESAMPLE_INTERPOLATE ?
    FIR_RES_INTERPOLATE : FIR_RES_FAST;
  int n = (int)ceil(log(res/f_cycles_per_sample)/log(2));
  fir_RES = 1 << n;

  // Allocate memory for FIR tables.
  delete[] fir;
  fir = new short[fir_N*fir_RES];

  // Calculate fir_RES FIR tables for linear interpolation.
  for (int i = 0; i < fir_RES; i++) {
    int fir_offset = i*fir_N + fir_N/2;
    double j_offset = double(i)/fir_RES;
    // Calculate FIR table. This is the sinc function, weighted by the
    // Kaiser window.
    for (int j = -fir_N/2; j <= fir_N/2; j++) {
      double jx = j - j_offset;
      double wt = wc*jx/f_cycles_per_sample;
      double temp = jx/(fir_N/2);
      double Kaiser =
	fabs(temp) <= 1 ? I0(beta*sqrt(1 - temp*temp))/I0beta : 0;
      double sincwt =
	fabs(wt) >= 1e-6 ? sin(wt)/wt : 1;
      double val =
	(1 << FIR_SHIFT)*filter_scale*f_samples_per_cycle*wc/pi*sincwt*Kaiser;
      fir[fir_offset + j] = short(val + 0.5);
    }
  }

  // Allocate sample buffer.
  if (!sample) {
    sample = new short[RINGSIZE*2];
  }
  // Clear sample buffer.
  for (int j = 0; j < RINGSIZE*2; j++) {
    sample[j] = 0;
  }
  sample_index = 0;

  return true;
}